

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_free(REF_GRID ref_grid)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  
  if (ref_grid == (REF_GRID)0x0) {
    return 2;
  }
  if (ref_grid->interp != (REF_INTERP)0x0) {
    uVar1 = ref_grid_free(ref_grid->interp->from_grid);
    if (uVar1 != 0) {
      pcVar3 = "free cached background grid";
      uVar2 = 199;
      goto LAB_0015a100;
    }
    uVar1 = ref_interp_free(ref_grid->interp);
    if (uVar1 != 0) {
      pcVar3 = "interp free";
      uVar2 = 200;
      goto LAB_0015a100;
    }
  }
  uVar1 = ref_adapt_free(ref_grid->adapt);
  if (uVar1 == 0) {
    uVar1 = ref_gather_free(ref_grid->gather);
    if (uVar1 == 0) {
      uVar1 = ref_geom_free(ref_grid->geom);
      if (uVar1 == 0) {
        lVar4 = 2;
        do {
          uVar1 = ref_cell_free(ref_grid->cell[lVar4 + -2]);
          if (uVar1 != 0) {
            pcVar3 = "cell free";
            uVar2 = 0xd0;
            goto LAB_0015a100;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x12);
        uVar1 = ref_node_free(ref_grid->node);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_free(ref_grid->mpi);
          if (uVar1 == 0) {
            free(ref_grid);
            return 0;
          }
          pcVar3 = "mpi free";
          uVar2 = 0xd4;
        }
        else {
          pcVar3 = "node free";
          uVar2 = 0xd3;
        }
      }
      else {
        pcVar3 = "geom free";
        uVar2 = 0xcd;
      }
    }
    else {
      pcVar3 = "gather free";
      uVar2 = 0xcc;
    }
  }
  else {
    pcVar3 = "adapt free";
    uVar2 = 0xcb;
  }
LAB_0015a100:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar2,
         "ref_grid_free",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_free(REF_GRID ref_grid) {
  REF_INT group;
  REF_CELL ref_cell;

  if (NULL == (void *)ref_grid) return REF_NULL;

  if (NULL != (void *)ref_grid_interp(ref_grid)) {
    RSS(ref_grid_free(ref_interp_from_grid(ref_grid_interp(ref_grid))),
        "free cached background grid");
    RSS(ref_interp_free(ref_grid->interp), "interp free");
  }

  RSS(ref_adapt_free(ref_grid->adapt), "adapt free");
  RSS(ref_gather_free(ref_grid_gather(ref_grid)), "gather free");
  RSS(ref_geom_free(ref_grid_geom(ref_grid)), "geom free");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_free(ref_cell), "cell free");
  }

  RSS(ref_node_free(ref_grid_node(ref_grid)), "node free");
  RSS(ref_mpi_free(ref_grid_mpi(ref_grid)), "mpi free");

  ref_free(ref_grid);
  return REF_SUCCESS;
}